

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O0

stackjit * __thiscall stackjit::toString_abi_cxx11_(stackjit *this,AccessModifier *accessModifier)

{
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  AccessModifier *local_18;
  AccessModifier *accessModifier_local;
  
  local_18 = accessModifier;
  accessModifier_local = (AccessModifier *)this;
  if (*accessModifier == Private) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"private",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else if (*accessModifier == Public) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"public",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  return this;
}

Assistant:

std::string toString(const AccessModifier& accessModifier) {
		switch (accessModifier) {
			case AccessModifier::Private:
				return "private";
			case AccessModifier::Public:
				return "public";
			default:
				return "";
		}
	}